

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# axl_sys_psx_Sem.cpp
# Opt level: O2

__pid_t __thiscall axl::sys::psx::NamedSem::wait(NamedSem *this,void *__stat_loc)

{
  bool bVar1;
  int iVar2;
  undefined3 extraout_var;
  uint_t timeout;
  timespec timespec;
  timespec local_28;
  
  timeout = (uint_t)__stat_loc;
  if (timeout == 0xffffffff) {
    iVar2 = sem_wait((sem_t *)(this->
                              super_Handle<sem_t_*,_axl::sys::psx::CloseNamedSem,_axl::sl::Zero<sem_t_*>_>
                              ).m_h);
  }
  else if (timeout == 0) {
    iVar2 = sem_trywait((sem_t *)(this->
                                 super_Handle<sem_t_*,_axl::sys::psx::CloseNamedSem,_axl::sl::Zero<sem_t_*>_>
                                 ).m_h);
  }
  else {
    local_28.tv_sec = 0;
    local_28.tv_nsec = 0;
    getAbsTimespecFromTimeout(timeout,&local_28);
    iVar2 = sem_timedwait((sem_t *)(this->
                                   super_Handle<sem_t_*,_axl::sys::psx::CloseNamedSem,_axl::sl::Zero<sem_t_*>_>
                                   ).m_h,(timespec *)&local_28);
  }
  bVar1 = err::complete((uint)(iVar2 == 0));
  return CONCAT31(extraout_var,bVar1);
}

Assistant:

bool
NamedSem::wait(uint_t timeout) {
	int result;

	switch (timeout) {
	case 0:
		result = ::sem_trywait(m_h);
		break;

	case -1:
		result = ::sem_wait(m_h);
		break;

	default:
		timespec timespec = { 0 };
		sys::getAbsTimespecFromTimeout(timeout, &timespec);
		result = ::sem_timedwait(m_h, &timespec);
	}

	return err::complete(result == 0);
}